

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Node::moveRight(Node *this)

{
  reference __a;
  reference __b;
  Node *this_00;
  vector<int,_std::allocator<int>_> local_60;
  Node *local_38;
  Node *child;
  vector<int,_std::allocator<int>_> temp;
  int zPos;
  Node *this_local;
  
  temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = findZero(this);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&child,&this->puzzle);
  if (((temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ != 2) &&
      (temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ != 5)) &&
     (temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ != 8)) {
    __a = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)&child,
                     (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_);
    __b = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)&child,
                     (long)(temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_ + 1));
    std::swap<int>(__a,__b);
  }
  this_00 = (Node *)operator_new(0x38);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_60,(vector<int,_std::allocator<int>_> *)&child);
  Node(this_00,&local_60,this);
  std::vector<int,_std::allocator<int>_>::~vector(&local_60);
  local_38 = this_00;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->children,&local_38);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&child);
  return;
}

Assistant:

void Node::moveRight() {
  int zPos = findZero();
  vector<int> temp = puzzle;
  if (zPos != 2 && zPos != 5 && zPos != 8)
    std::swap(temp[zPos], temp[zPos + 1]);
  Node* child = new Node(temp, this);
  children.push_back(child);
}